

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

GLint gl4cts::SparseTextureUtils::getTargetDepth(GLint target)

{
  if (target < 0x8c1a) {
    if (((target != 0x806f) && (target != 0x8513)) && (target != 0x8c18)) {
      return 0;
    }
  }
  else if ((target != 0x8c1a) && (target != 0x9102)) {
    if (target != 0x9009) {
      return 0;
    }
    return 6;
  }
  return 1;
}

Assistant:

GLint SparseTextureUtils::getTargetDepth(GLint target)
{
	GLint depth;

	if (target == GL_TEXTURE_3D || target == GL_TEXTURE_1D_ARRAY || target == GL_TEXTURE_2D_ARRAY ||
		target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY || target == GL_TEXTURE_CUBE_MAP)
	{
		depth = 1;
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
		depth = 6;
	else
		depth = 0;

	return depth;
}